

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O0

optional<pizza_slice> * __thiscall
pizza_cutter::create_slice_for
          (optional<pizza_slice> *__return_storage_ptr__,pizza_cutter *this,int row,int col)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pizza_slice ps;
  bool bVar3;
  const_reference this_00;
  const_reference pvVar4;
  pizza_slice *ppVar5;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var6;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var7;
  pizza_slice ps_00;
  byte local_c9;
  type *tomatoes;
  type *mushrooms;
  undefined1 local_74 [32];
  value_type d;
  const_iterator __end2;
  const_iterator __begin2;
  array<pizza_cutter::direction,_4UL> *__range2;
  pizza_slice candidate;
  bool all_is_too_large;
  bool could_be_extended;
  bool look_for_next;
  pizza_slice slice;
  int col_local;
  int row_local;
  pizza_cutter *this_local;
  
  this_00 = std::
            vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
            ::operator[](&this->pizza_,(long)row);
  pvVar4 = std::vector<pizza_cell,_std::allocator<pizza_cell>_>::operator[](this_00,(long)col);
  if (pvVar4->owner == -1) {
    stack0xffffffffffffffd4 = (pointer)CONCAT44(col,row);
    slice.col1 = col;
    slice.row1 = row;
    candidate.row2._3_1_ = 1;
    while (candidate.row2._3_1_ != 0) {
      candidate.row2._2_1_ = 0;
      candidate.row2._1_1_ = 1;
      __begin2 = directions._M_elems;
      __end2 = std::array<pizza_cutter::direction,_4UL>::begin(&directions);
      register0x00000000 = std::array<pizza_cutter::direction,_4UL>::end(&directions);
      for (; __end2 != stack0xffffffffffffffa8; __end2 = __end2 + 1) {
        local_74._24_4_ = *__end2;
        local_74._8_8_ = stack0xffffffffffffffd4;
        local_74._16_4_ = slice.row1;
        local_74._20_4_ = slice.col1;
        ps.row2 = slice.row1;
        ps.col2 = slice.col1;
        ps._0_8_ = stack0xffffffffffffffd4;
        extend_slice(__return_storage_ptr__,this,ps,local_74._24_4_);
        bVar3 = std::optional::operator_cast_to_bool((optional *)__return_storage_ptr__);
        if (bVar3) {
          candidate.row2._2_1_ = 1;
          ppVar5 = std::optional<pizza_slice>::value(__return_storage_ptr__);
          uVar1 = ppVar5->row1;
          uVar2 = ppVar5->col1;
          ps_00.col2 = uVar2;
          ps_00.row2 = uVar1;
          ps_00._0_8_ = this;
          count_ingredients((pizza_cutter *)local_74,ps_00);
          p_Var6 = std::get<0ul,int,int>((tuple<int,_int> *)local_74);
          p_Var7 = std::get<1ul,int,int>((tuple<int,_int> *)local_74);
          bVar3 = is_too_large(this,*p_Var6,*p_Var7);
          if (!bVar3) {
            candidate.row2._1_1_ = 0;
            bVar3 = is_minimum_ingredients(this,*p_Var6,*p_Var7);
            if (bVar3) {
              return __return_storage_ptr__;
            }
            ppVar5 = std::optional<pizza_slice>::value(__return_storage_ptr__);
            __range2 = *(array<pizza_cutter::direction,_4UL> **)ppVar5;
            candidate.row1 = ppVar5->row2;
            candidate.col1 = ppVar5->col2;
          }
        }
      }
      unique0x00012000 = (pointer)__range2;
      slice.row1 = candidate.row1;
      slice.col1 = candidate.col1;
      local_c9 = 0;
      if ((candidate.row2._2_1_ & 1) != 0) {
        local_c9 = candidate.row2._1_1_ ^ 0xff;
      }
      candidate.row2._3_1_ = local_c9 & 1;
    }
    std::optional<pizza_slice>::optional(__return_storage_ptr__);
  }
  else {
    std::optional<pizza_slice>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<pizza_slice> pizza_cutter::create_slice_for(int row, int col) const noexcept
{
    if (pizza_[row][col].owner != -1) return std::nullopt;

    pizza_slice slice{row, col, row, col};

    bool look_for_next = true;
    while (look_for_next) {
        bool could_be_extended = false;
        bool all_is_too_large = true;

        pizza_slice candidate;
        for (auto d : directions) {
            auto new_slice = extend_slice(slice, d);

            if (new_slice) {
                could_be_extended = true;
                auto [mushrooms, tomatoes] = count_ingredients(new_slice.value());

                if (is_too_large(mushrooms, tomatoes))
                    continue;

                all_is_too_large = false;

                if (is_minimum_ingredients(mushrooms, tomatoes))
                    return new_slice;

                candidate = new_slice.value();
            }
        }
        slice = candidate;
        look_for_next = could_be_extended && !all_is_too_large;
    }

    return std::nullopt;
}